

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

bool __thiscall QMdiSubWindowPrivate::restoreFocus(QMdiSubWindowPrivate *this)

{
  QPointer<QWidget> *this_00;
  Data *pDVar1;
  bool bVar2;
  FocusPolicy FVar3;
  QWidget *this_01;
  
  this_00 = &this->restoreFocusWidget;
  bVar2 = QWeakPointer<QObject>::isNull(&this_00->wp);
  if (bVar2) {
    return false;
  }
  pDVar1 = (this_00->wp).d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    this_01 = (QWidget *)0x0;
  }
  else {
    this_01 = (QWidget *)(this->restoreFocusWidget).wp.value;
  }
  QWeakPointer<QObject>::clear(&this_00->wp);
  bVar2 = QWidget::hasFocus(this_01);
  if ((((!bVar2) &&
       (bVar2 = QWidget::isAncestorOf(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8,this_01),
       bVar2)) && ((this_01->data->widget_attributes & 0x8000) != 0)) &&
     (FVar3 = QWidget::focusPolicy(this_01), FVar3 != NoFocus)) {
    QWidget::setFocus(this_01);
    return true;
  }
  bVar2 = QWidget::hasFocus(this_01);
  return bVar2;
}

Assistant:

bool QMdiSubWindowPrivate::restoreFocus()
{
    if (restoreFocusWidget.isNull())
        return false;
    QWidget *candidate = restoreFocusWidget;
    restoreFocusWidget.clear();
    if (!candidate->hasFocus() && q_func()->isAncestorOf(candidate)
        && candidate->isVisible()
        && candidate->focusPolicy() != Qt::NoFocus) {
        candidate->setFocus();
        return true;
    }
    return candidate->hasFocus();
}